

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::AddCopy
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  void *__dest;
  int in_EDX;
  vector<void_*,_std::allocator<void_*>_> *in_RSI;
  void *copy;
  int in_stack_0000015c;
  void *in_stack_00000160;
  EncodedDescriptorDatabase *in_stack_00000168;
  undefined4 in_stack_ffffffffffffffe8;
  
  __dest = operator_new((long)in_EDX);
  memcpy(__dest,in_RSI,(long)in_EDX);
  std::vector<void_*,_std::allocator<void_*>_>::push_back
            (in_RSI,(value_type *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  bVar1 = Add(in_stack_00000168,in_stack_00000160,in_stack_0000015c);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::AddCopy(const void* encoded_file_descriptor,
                                        int size) {
  void* copy = operator new(size);
  memcpy(copy, encoded_file_descriptor, size);
  files_to_delete_.push_back(copy);
  return Add(copy, size);
}